

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_A.cpp
# Opt level: O0

void __thiscall A::A(A *this,int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  ostream *poVar6;
  int in_ESI;
  int *in_RDI;
  int j;
  int i;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffffb8;
  scoped_lock *in_stack_ffffffffffffffc0;
  int local_2c;
  int local_28;
  
  *in_RDI = in_ESI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_ESI * in_ESI);
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *(void **)(in_RDI + 2) = pvVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(in_ESI * in_ESI);
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *(void **)(in_RDI + 4) = pvVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(in_ESI * in_ESI);
  uVar4 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *(void **)(in_RDI + 6) = pvVar5;
  spin_mutex_t::scoped_lock::scoped_lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  poVar6 = std::operator<<((ostream *)&std::cerr,"Building A of sz=");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*in_RDI);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x125163);
  for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < *in_RDI; local_2c = local_2c + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 6) + (long)(local_28 * in_ESI + local_2c) * 4) = 0;
      *(float *)(*(long *)(in_RDI + 2) + (long)(local_28 * in_ESI + local_2c) * 4) =
           (float)(local_28 + local_2c);
      *(float *)(*(long *)(in_RDI + 4) + (long)(local_28 * in_ESI + local_2c) * 4) =
           (float)(local_28 - local_2c);
    }
  }
  return;
}

Assistant:

A(int n)
  : n_(n), a(new float[n *n ]), b(new float[n *n ]), c(new float[n *n ])
  {
    LOG("Building A of sz=" << n_);
    
    for(int i = 0; i < n_; i++)
      for(int j = 0; j < n_; j++) {
        c[i*n+j] = 0;
        a[i*n+j] = i + j;
        b[i*n+j] = i - j;
      }
    
  }